

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

ErrorData * __thiscall
duckdb::ClientContext::EndQueryInternal
          (ErrorData *__return_storage_ptr__,ClientContext *this,ClientContextLock *lock,
          bool success,bool invalidate_transaction,
          optional_ptr<duckdb::ErrorData,_true> previous_error)

{
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *this_00;
  unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
  *this_01;
  TransactionContext *this_02;
  _Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
  __ptr;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var1;
  LoggingContext context;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var2;
  pointer this_03;
  QueryProfiler *this_04;
  pointer pAVar3;
  pointer this_05;
  MetaTransaction *o;
  pointer pLVar4;
  DatabaseInstance *pDVar5;
  type pLVar6;
  pointer this_06;
  ClientContextState *pCVar7;
  shared_ptr<duckdb::ClientContextState,_true> *s;
  optional_idx oVar8;
  undefined7 uStack_137;
  string local_d0;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_b0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  
  this_03 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
            operator->(&this->client_data);
  this_04 = shared_ptr<duckdb::QueryProfiler,_true>::operator->(&this_03->profiler);
  QueryProfiler::EndQuery(this_04);
  this_01 = &this->active_query;
  pAVar3 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
           ::operator->(this_01);
  if ((pAVar3->executor).super_unique_ptr<duckdb::Executor,_std::default_delete<duckdb::Executor>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Executor,_std::default_delete<duckdb::Executor>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Executor_*,_std::default_delete<duckdb::Executor>_>.
      super__Head_base<0UL,_duckdb::Executor_*,_false>._M_head_impl != (Executor *)0x0) {
    pAVar3 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
             ::operator->(this_01);
    this_05 = unique_ptr<duckdb::Executor,_std::default_delete<duckdb::Executor>,_true>::operator->
                        (&pAVar3->executor);
    Executor::CancelTasks(this_05);
  }
  pAVar3 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
           ::operator->(this_01);
  ::std::__uniq_ptr_impl<duckdb::ProgressBar,_std::default_delete<duckdb::ProgressBar>_>::reset
            ((__uniq_ptr_impl<duckdb::ProgressBar,_std::default_delete<duckdb::ProgressBar>_> *)
             &pAVar3->progress_bar,(pointer)0x0);
  __ptr.super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl =
       (this_01->
       super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
       .super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>;
  (this_01->
  super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
  .super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false> =
       (_Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>)0x0;
  if (__ptr.super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl !=
      (ActiveQueryContext *)0x0) {
    ::std::default_delete<duckdb::ActiveQueryContext>::operator()
              ((default_delete<duckdb::ActiveQueryContext> *)this_01,
               (ActiveQueryContext *)
               __ptr.super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl);
  }
  QueryProgress::Initialize(&this->query_progress);
  ErrorData::ErrorData(__return_storage_ptr__);
  if ((this->transaction).current_transaction.
      super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>._M_t.
      super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
      .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl !=
      (MetaTransaction *)0x0) {
    this_02 = &this->transaction;
    TransactionContext::ResetActiveQuery(this_02);
    if ((this->transaction).auto_commit == true) {
      if (success) {
        TransactionContext::Commit(this_02);
      }
      else {
        TransactionContext::Rollback(this_02,previous_error);
      }
    }
    else if (invalidate_transaction) {
      o = TransactionContext::ActiveTransaction(this_02);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Failed to commit","");
      ValidChecker::Invalidate<duckdb::MetaTransaction>(o,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
  }
  this_00 = &this->logger;
  pLVar4 = unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true>::operator->
                     (this_00);
  (*pLVar4->_vptr_Logger[4])(pLVar4);
  optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffff50,(idx_t)this);
  oVar8.index = (idx_t)local_b0._M_head_impl;
  pDVar5 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->db);
  pLVar6 = shared_ptr<duckdb::LogManager,_true>::operator*(&pDVar5->log_manager);
  context._1_7_ = uStack_137;
  context.scope = 0x14;
  context.thread_id.index = 0xffffffffffffffff;
  context.connection_id.index = oVar8.index;
  context.transaction_id.index = 0xffffffffffffffff;
  context.query_id.index = 0xffffffffffffffff;
  LogManager::CreateLogger((LogManager *)&stack0xffffffffffffff50,context,SUB81(pLVar6,0),true);
  _Var2._M_head_impl = local_b0._M_head_impl;
  local_b0._M_head_impl = (Logger *)0x0;
  _Var1._M_head_impl =
       (this_00->super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
       super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (Logger *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Logger + 8))();
    if (local_b0._M_head_impl != (Logger *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  this_06 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
            ::operator->(&this->registered_state);
  RegisteredStateManager::States
            ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)
             &stack0xffffffffffffff50,this_06);
  for (oVar8.index = (idx_t)local_b0._M_head_impl;
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)oVar8.index != local_a8._M_pi;
      oVar8.index = oVar8.index + 0x10) {
    if (__return_storage_ptr__->initialized == true) {
      pCVar7 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                         ((shared_ptr<duckdb::ClientContextState,_true> *)oVar8.index);
      (**(code **)(*(long *)pCVar7 + 0x28))(pCVar7,this,__return_storage_ptr__);
    }
    else {
      pCVar7 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                         ((shared_ptr<duckdb::ClientContextState,_true> *)oVar8.index);
      (**(code **)(*(long *)pCVar7 + 0x28))(pCVar7,this,previous_error.ptr);
    }
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
             *)&stack0xffffffffffffff50);
  return __return_storage_ptr__;
}

Assistant:

ErrorData ClientContext::EndQueryInternal(ClientContextLock &lock, bool success, bool invalidate_transaction,
                                          optional_ptr<ErrorData> previous_error) {
	client_data->profiler->EndQuery();

	if (active_query->executor) {
		active_query->executor->CancelTasks();
	}
	active_query->progress_bar.reset();
	D_ASSERT(active_query.get());
	active_query.reset();
	query_progress.Initialize();
	ErrorData error;
	try {
		if (transaction.HasActiveTransaction()) {
			transaction.ResetActiveQuery();
			if (transaction.IsAutoCommit()) {
				if (success) {
					transaction.Commit();
				} else {
					transaction.Rollback(previous_error);
				}
			} else if (invalidate_transaction) {
				D_ASSERT(!success);
				ValidChecker::Invalidate(ActiveTransaction(), "Failed to commit");
			}
		}
	} catch (std::exception &ex) {
		error = ErrorData(ex);
		if (Exception::InvalidatesDatabase(error.Type()) || error.Type() == ExceptionType::INTERNAL) {
			auto &db_inst = DatabaseInstance::GetDatabase(*this);
			ValidChecker::Invalidate(db_inst, error.RawMessage());
		}
	} catch (...) { // LCOV_EXCL_START
		error = ErrorData("Unhandled exception!");
	} // LCOV_EXCL_STOP

	// Refresh the logger
	logger->Flush();
	LoggingContext context(LogContextScope::CONNECTION);
	context.connection_id = reinterpret_cast<idx_t>(this);
	logger = db->GetLogManager().CreateLogger(context, true);

	// Notify any registered state of query end
	for (auto const &s : registered_state->States()) {
		if (error.HasError()) {
			s->QueryEnd(*this, &error);
		} else {
			s->QueryEnd(*this, previous_error);
		}
	}

	return error;
}